

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

void __thiscall QAbstractTestLogger::filterUnprintable(QAbstractTestLogger *this,char *str)

{
  uchar *idx;
  char *str_local;
  QAbstractTestLogger *this_local;
  
  for (idx = (uchar *)str; *idx != '\0'; idx = idx + 1) {
    if ((((*idx < 0x20) && (*idx != '\n')) && (*idx != '\t')) || (*idx == '\x7f')) {
      *idx = '?';
    }
  }
  return;
}

Assistant:

void QAbstractTestLogger::filterUnprintable(char *str) const
{
    unsigned char *idx = reinterpret_cast<unsigned char *>(str);
    while (*idx) {
        if (((*idx < 0x20 && *idx != '\n' && *idx != '\t') || *idx == 0x7f))
            *idx = '?';
        ++idx;
    }
}